

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O3

void __thiscall
slang::ast::builtins::StringPutcMethod::StringPutcMethod(StringPutcMethod *this,Compilation *comp)

{
  initializer_list<const_slang::ast::Type_*> __l;
  allocator_type local_61;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_60;
  string local_48;
  Type *local_28;
  Type *pTStack_20;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"putc","");
  local_28 = comp->intType;
  pTStack_20 = comp->byteType;
  __l._M_len = 2;
  __l._M_array = &local_28;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&local_60,__l,&local_61);
  SimpleSystemSubroutine::SimpleSystemSubroutine
            (&this->super_SimpleSystemSubroutine,&local_48,Function,2,&local_60,comp->voidType,true,
             true);
  if (local_60.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_60.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.
                          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  (this->super_SimpleSystemSubroutine).super_SystemSubroutine._vptr_SystemSubroutine =
       (_func_int **)&PTR__SimpleSystemSubroutine_0050ef90;
  return;
}

Assistant:

explicit StringPutcMethod(Compilation& comp) :
        SimpleSystemSubroutine("putc", SubroutineKind::Function, 2,
                               {&comp.getIntType(), &comp.getByteType()}, comp.getVoidType(), true,
                               /* isFirstArgLValue */ true) {}